

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cpp
# Opt level: O0

void test_ptr<std::shared_ptr<int>>(void)

{
  int iVar1;
  byte bVar2;
  undefined4 *puVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  ostringstream oss_7;
  ostringstream oss_6;
  shared_ptr<int> y_3;
  shared_ptr<int> x_3;
  archive a_3;
  ostringstream oss_5;
  ostringstream oss_4;
  shared_ptr<int> y_2;
  shared_ptr<int> x_2;
  archive a_2;
  ostringstream oss_3;
  ostringstream oss_2;
  shared_ptr<int> y_1;
  shared_ptr<int> x_1;
  archive a_1;
  ostringstream oss_1;
  ostringstream oss;
  shared_ptr<int> y;
  shared_ptr<int> x;
  archive a;
  shared_ptr<int> *in_stack_ffffffffffffefe8;
  archive *in_stack_ffffffffffffeff0;
  string local_e68 [32];
  ostringstream local_e48 [383];
  undefined1 local_cc9;
  string local_cc8 [32];
  ostringstream local_ca8 [376];
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_b30 [2];
  archive local_b10 [63];
  undefined1 local_ad1;
  string local_ad0 [32];
  ostringstream local_ab0 [383];
  undefined1 local_931;
  string local_930 [32];
  ostringstream local_910 [376];
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_798 [2];
  archive local_778 [63];
  undefined1 local_739;
  string local_738 [32];
  ostringstream local_718 [383];
  undefined1 local_599;
  string local_598 [32];
  ostringstream local_578 [376];
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_3f0;
  archive local_3e0 [63];
  undefined1 local_3a1;
  string local_3a0 [32];
  ostringstream local_380 [383];
  undefined1 local_201;
  string local_200 [32];
  ostringstream local_1e0 [376];
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_68 [2];
  __shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_48;
  archive local_38 [56];
  
  cppcms::archive::archive(local_38);
  puVar3 = (undefined4 *)operator_new(4);
  *puVar3 = 0xf;
  std::shared_ptr<int>::shared_ptr<int,void>
            ((shared_ptr<int> *)in_stack_ffffffffffffeff0,(int *)in_stack_ffffffffffffefe8);
  std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)0x12b052);
  cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  cppcms::archive::mode(local_38,1);
  cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  peVar4 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_ffffffffffffeff0);
  iVar1 = *peVar4;
  peVar4 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      in_stack_ffffffffffffeff0);
  if (iVar1 == *peVar4) {
    peVar5 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get(&local_48);
    peVar6 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get(local_68);
    if (peVar5 != peVar6) {
      bVar2 = cppcms::archive::eof();
      if ((bVar2 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_380);
        poVar7 = std::operator<<((ostream *)local_380,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x7b);
        std::operator<<(poVar7," a.eof()");
        local_3a1 = 1;
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar8,local_3a0);
        local_3a1 = 0;
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12b471);
      std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12b47e);
      cppcms::archive::~archive(local_38);
      cppcms::archive::archive(local_3e0);
      puVar3 = (undefined4 *)operator_new(4);
      *puVar3 = 0xf;
      std::shared_ptr<int>::shared_ptr<int,void>
                ((shared_ptr<int> *)in_stack_ffffffffffffeff0,(int *)in_stack_ffffffffffffefe8);
      std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)0x12b4d6);
      cppcms::operator<<(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      cppcms::archive::mode(local_3e0,1);
      cppcms::operator>>(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      peVar4 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          in_stack_ffffffffffffeff0);
      iVar1 = *peVar4;
      peVar4 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          in_stack_ffffffffffffeff0);
      if (iVar1 == *peVar4) {
        peVar5 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get(&local_3f0);
        peVar6 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get(&local_400);
        if (peVar5 != peVar6) {
          bVar2 = cppcms::archive::eof();
          if ((bVar2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream(local_718);
            poVar7 = std::operator<<((ostream *)local_718,"Error ");
            poVar7 = std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x86);
            std::operator<<(poVar7," a.eof()");
            local_739 = 1;
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::runtime_error::runtime_error(prVar8,local_738);
            local_739 = 0;
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12b925);
          std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12b932);
          cppcms::archive::~archive(local_3e0);
          cppcms::archive::archive(local_778);
          std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)0x12b959);
          puVar3 = (undefined4 *)operator_new(4);
          *puVar3 = 0xf;
          std::shared_ptr<int>::shared_ptr<int,void>
                    ((shared_ptr<int> *)in_stack_ffffffffffffeff0,(int *)in_stack_ffffffffffffefe8);
          cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          cppcms::archive::mode(local_778,1);
          cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          peVar5 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get(local_798);
          if (peVar5 != (element_type *)0x0) {
            std::__cxx11::ostringstream::ostringstream(local_910);
            poVar7 = std::operator<<((ostream *)local_910,"Error ");
            poVar7 = std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8f);
            std::operator<<(poVar7," y.get()==0");
            local_931 = 1;
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::runtime_error::runtime_error(prVar8,local_930);
            local_931 = 0;
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar2 = cppcms::archive::eof();
          if ((bVar2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream(local_ab0);
            poVar7 = std::operator<<((ostream *)local_ab0,"Error ");
            poVar7 = std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x90);
            std::operator<<(poVar7," a.eof()");
            local_ad1 = 1;
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::runtime_error::runtime_error(prVar8,local_ad0);
            local_ad1 = 0;
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12bd6d);
          std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12bd7a);
          cppcms::archive::~archive(local_778);
          cppcms::archive::archive(local_b10);
          std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)0x12bda1);
          puVar3 = (undefined4 *)operator_new(4);
          *puVar3 = 0xf;
          std::shared_ptr<int>::shared_ptr<int,void>
                    ((shared_ptr<int> *)in_stack_ffffffffffffeff0,(int *)in_stack_ffffffffffffefe8);
          cppcms::operator<<(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          cppcms::archive::mode(local_b10,1);
          cppcms::operator>>(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          peVar5 = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get(local_b30);
          if (peVar5 == (element_type *)0x0) {
            bVar2 = cppcms::archive::eof();
            if ((bVar2 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream(local_e48);
              poVar7 = std::operator<<((ostream *)local_e48,"Error ");
              poVar7 = std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                      );
              poVar7 = std::operator<<(poVar7,":");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x9a);
              std::operator<<(poVar7," a.eof()");
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::ostringstream::str();
              std::runtime_error::runtime_error(prVar8,local_e68);
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12c176);
            std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x12c183);
            cppcms::archive::~archive(local_b10);
            return;
          }
          std::__cxx11::ostringstream::ostringstream(local_ca8);
          poVar7 = std::operator<<((ostream *)local_ca8,"Error ");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x99);
          std::operator<<(poVar7," y.get()==0");
          local_cc9 = 1;
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          std::runtime_error::runtime_error(prVar8,local_cc8);
          local_cc9 = 0;
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream(local_578);
      poVar7 = std::operator<<((ostream *)local_578,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x85);
      std::operator<<(poVar7," *x==*y && x.get()!=y.get()");
      local_599 = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar8,local_598);
      local_599 = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  poVar7 = std::operator<<((ostream *)local_1e0,"Error ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                          );
  poVar7 = std::operator<<(poVar7,":");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x7a);
  std::operator<<(poVar7," *x==*y && x.get()!=y.get()");
  local_201 = 1;
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar8,local_200);
  local_201 = 0;
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_ptr()
{
	{
		cppcms::archive a;
		Pointer x(new int(15)),y;
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer const x(new int(15));
		Pointer y;
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer x,y(new int(15));
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(y.get()==0);
		TEST(a.eof());
	}
	{
		cppcms::archive a;
		Pointer const x;
		Pointer y(new int(15));
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(y.get()==0);
		TEST(a.eof());
	}

}